

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFactoryRegistry.cpp
# Opt level: O3

void __thiscall tcu::GenericFactoryRegistry::~GenericFactoryRegistry(GenericFactoryRegistry *this)

{
  pointer ppAVar1;
  pointer ppAVar2;
  
  ppAVar2 = (this->m_factories).
            super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppAVar1 = (this->m_factories).
            super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  if (ppAVar2 != ppAVar1) {
    do {
      if (*ppAVar2 != (AbstractFactory *)0x0) {
        (*(*ppAVar2)->_vptr_AbstractFactory[1])();
        ppAVar1 = (this->m_factories).
                  super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      }
      ppAVar2 = ppAVar2 + 1;
    } while (ppAVar2 != ppAVar1);
    ppAVar2 = (this->m_factories).
              super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
  }
  if (ppAVar2 != (pointer)0x0) {
    operator_delete(ppAVar2,(long)(this->m_factories).
                                  super__Vector_base<tcu::AbstractFactory_*,_std::allocator<tcu::AbstractFactory_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppAVar2
                   );
    return;
  }
  return;
}

Assistant:

GenericFactoryRegistry::~GenericFactoryRegistry (void)
{
	for (std::vector<AbstractFactory*>::const_iterator i = m_factories.begin(); i != m_factories.end(); ++i)
		delete *i;
}